

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O0

void Rasterizer::doRender<RasterizerA3<8u>>(RasterizerA3<8U> *self,uint32_t argb32)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t argb32_local;
  RasterizerA3<8U> *self_local;
  
  uVar2 = fillMode((Rasterizer *)self);
  if (uVar2 == 1) {
    bVar1 = hasOption((Rasterizer *)self,1);
    if (bVar1) {
      RasterizerA3<8u>::_renderImpl<CompositorSIMD,true>((RasterizerA3<8u> *)self,argb32);
    }
    else {
      RasterizerA3<8u>::_renderImpl<CompositorScalar,true>((RasterizerA3<8u> *)self,argb32);
    }
  }
  else {
    bVar1 = hasOption((Rasterizer *)self,1);
    if (bVar1) {
      RasterizerA3<8u>::_renderImpl<CompositorSIMD,false>((RasterizerA3<8u> *)self,argb32);
    }
    else {
      RasterizerA3<8u>::_renderImpl<CompositorScalar,false>((RasterizerA3<8u> *)self,argb32);
    }
  }
  return;
}

Assistant:

static void doRender(SELF& self, uint32_t argb32) noexcept {
    if (self.fillMode() == kFillNonZero) {
      if (self.hasOption(kOptionSIMD))
        self.template _renderImpl<CompositorSIMD, true>(argb32);
      else
        self.template _renderImpl<CompositorScalar, true>(argb32);
    }
    else {
      if (self.hasOption(kOptionSIMD))
        self.template _renderImpl<CompositorSIMD, false>(argb32);
      else
        self.template _renderImpl<CompositorScalar, false>(argb32);
    }
  }